

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_queue.cpp
# Opt level: O3

void __thiscall
foxxll::linuxaio_queue::linuxaio_queue(linuxaio_queue *this,int desired_queue_length)

{
  uint uVar1;
  long lVar2;
  int *piVar3;
  ostream *poVar4;
  char *pcVar5;
  io_error *this_00;
  __sighandler_t __handler;
  ulong uVar6;
  ostringstream msg;
  string local_1c8;
  Logger local_1a8;
  
  (this->super_request_queue_impl_worker).super_request_queue._vptr_request_queue =
       (_func_int **)&PTR_add_request_00167ee8;
  (this->waiting_mtx_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->waiting_mtx_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->waiting_mtx_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->waiting_mtx_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->waiting_mtx_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->waiting_requests_).
  super__List_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->waiting_requests_;
  (this->waiting_requests_).
  super__List_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->waiting_requests_;
  (this->waiting_requests_).
  super__List_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->num_waiting_requests_).value_ = 0;
  (this->num_waiting_requests_).mutex_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->num_waiting_requests_).mutex_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->num_waiting_requests_).mutex_.super___mutex_base._M_mutex + 0x10) =
       0;
  (this->num_waiting_requests_).mutex_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->num_waiting_requests_).mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&(this->num_waiting_requests_).cv_);
  (this->num_free_events_).mutex_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->num_free_events_).mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->num_free_events_).mutex_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->num_free_events_).mutex_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->num_free_events_).value_ = 0;
  (this->num_free_events_).mutex_.super___mutex_base._M_mutex.__align = 0;
  std::condition_variable::condition_variable(&(this->num_free_events_).cv_);
  (this->num_posted_requests_).mutex_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->num_posted_requests_).mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->num_posted_requests_).mutex_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->num_posted_requests_).mutex_.super___mutex_base._M_mutex + 0x10) = 0
  ;
  (this->num_posted_requests_).value_ = 0;
  (this->num_posted_requests_).mutex_.super___mutex_base._M_mutex.__align = 0;
  std::condition_variable::condition_variable(&(this->num_posted_requests_).cv_);
  (this->post_thread_state_).mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->post_thread_state_).mutex_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->post_thread_state_).mutex_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->post_thread_state_).mutex_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->post_thread_state_).mutex_.super___mutex_base._M_mutex + 8) = 0;
  (this->post_thread_)._M_id._M_thread = 0;
  (this->wait_thread_)._M_id._M_thread = 0;
  std::condition_variable::condition_variable(&(this->post_thread_state_).cv_);
  (this->post_thread_state_).state_ = NOT_RUNNING;
  (this->wait_thread_state_).mutex_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->wait_thread_state_).mutex_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->wait_thread_state_).mutex_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->wait_thread_state_).mutex_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->wait_thread_state_).mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&(this->wait_thread_state_).cv_);
  uVar6 = 0x40;
  if (desired_queue_length != 0) {
    uVar6 = (ulong)(uint)desired_queue_length;
  }
  (this->wait_thread_state_).state_ = NOT_RUNNING;
  this->max_events_ = (int)uVar6;
  this->context_ = 0;
  while( true ) {
    lVar2 = syscall(0xce,uVar6,&this->context_);
    if (lVar2 != -1) break;
    piVar3 = __errno_location();
    if ((*piVar3 != 0xb) || (this->max_events_ < 2)) goto LAB_00149161;
    uVar1 = this->max_events_ * 2;
    uVar6 = (ulong)uVar1;
    this->max_events_ = uVar1;
  }
  if (lVar2 == 0) {
    tlx::Semaphore::signal(&this->num_free_events_,this->max_events_,__handler);
    tlx::Logger::Logger(&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Set up an linuxaio queue with ",0x1e);
    std::ostream::operator<<((ostream *)&local_1a8,this->max_events_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," entries.",9);
    tlx::Logger::~Logger(&local_1a8);
    request_queue_impl_worker::start_thread
              (&this->super_request_queue_impl_worker,post_async,this,&this->post_thread_,
               &this->post_thread_state_);
    request_queue_impl_worker::start_thread
              (&this->super_request_queue_impl_worker,wait_async,this,&this->wait_thread_,
               &this->wait_thread_state_);
    return;
  }
LAB_00149161:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Error in ",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"foxxll::linuxaio_queue::linuxaio_queue(int)",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," : ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"linuxaio_queue::linuxaio_queue io_setup() nr_events=",0x34);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_1a8,this->max_events_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
  piVar3 = __errno_location();
  pcVar5 = strerror(*piVar3);
  std::operator<<(poVar4,pcVar5);
  this_00 = (io_error *)__cxa_allocate_exception(0x20);
  std::__cxx11::stringbuf::str();
  io_error::io_error(this_00,&local_1c8);
  __cxa_throw(this_00,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

linuxaio_queue::linuxaio_queue(int desired_queue_length)
    : num_waiting_requests_(0), num_free_events_(0), num_posted_requests_(0),
      post_thread_state_(NOT_RUNNING), wait_thread_state_(NOT_RUNNING)
{
    if (desired_queue_length == 0) {
        // default value, 64 entries per queue (i.e. usually per disk) should
        // be enough
        max_events_ = 64;
    }
    else
        max_events_ = desired_queue_length;

    // negotiate maximum number of simultaneous events with the OS
    context_ = 0;
    long result;
    while ((result = syscall(SYS_io_setup, max_events_, &context_)) == -1 &&
           errno == EAGAIN && max_events_ > 1)
    {
        max_events_ <<= 1;               // try with half as many events
    }
    if (result != 0) {
        FOXXLL_THROW_ERRNO(
            io_error, "linuxaio_queue::linuxaio_queue"
            " io_setup() nr_events=" << max_events_
        );
    }

    num_free_events_.signal(max_events_);

    TLX_LOG1 << "Set up an linuxaio queue with " << max_events_ << " entries.";

    start_thread(post_async, static_cast<void*>(this), post_thread_, post_thread_state_);
    start_thread(wait_async, static_cast<void*>(this), wait_thread_, wait_thread_state_);
}